

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O0

int GetLatestHokuyoMessageHokuyo(HOKUYO *pHokuyo,char *databuf,int databuflen,int *pNbdatabytes)

{
  int iVar1;
  double dVar2;
  int local_60b4;
  undefined1 local_60b0 [8];
  CHRONO chrono;
  int PartialDataBlockLen;
  int nbFullDataBlocks;
  int k;
  int j;
  int i;
  int len;
  char *ptr;
  int local_6040;
  int recvbuflen;
  int Bytes;
  int BytesReceived;
  char savebuf [8192];
  char recvbuf [16384];
  int *pNbdatabytes_local;
  int databuflen_local;
  char *databuf_local;
  HOKUYO *pHokuyo_local;
  
  recvbuflen = 0;
  local_6040 = 0;
  ptr._4_4_ = 0;
  _i = (char *)0x0;
  j = 0;
  chrono._68_4_ = 0;
  chrono.Suspended = 0;
  StartChrono((CHRONO *)local_60b0);
  memset(savebuf + 0x1ff8,0,0x4000);
  memset(&Bytes,0,0x2000);
  ptr._4_4_ = 0x1fff;
  recvbuflen = 0;
  iVar1 = ReadRS232Port(&pHokuyo->RS232Port,(uint8 *)(savebuf + 0x1ff8),0x1fff,&local_6040);
  if (iVar1 == 0) {
    recvbuflen = local_6040 + recvbuflen;
    if (ptr._4_4_ <= recvbuflen) {
      while (local_6040 == ptr._4_4_) {
        dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_60b0);
        if (4.0 < dVar2) {
          printf("Error reading data from a Hokuyo : Message timeout. \n");
          return 2;
        }
        memcpy(&Bytes,savebuf + 0x1ff8,(long)local_6040);
        iVar1 = ReadRS232Port(&pHokuyo->RS232Port,(uint8 *)(savebuf + 0x1ff8),ptr._4_4_,&local_6040)
        ;
        if (iVar1 != 0) {
          printf("Error reading data from a Hokuyo. \n");
          return 1;
        }
        recvbuflen = local_6040 + recvbuflen;
      }
      memmove(savebuf + ((long)ptr._4_4_ - (long)local_6040) + 0x1ff8,savebuf + 0x1ff8,
              (long)local_6040);
      memcpy(savebuf + 0x1ff8,(void *)((long)&Bytes + (long)local_6040),
             (long)(ptr._4_4_ - local_6040));
      recvbuflen = ptr._4_4_;
    }
    while (iVar1 = FindLatestHokuyoMessage(savebuf + 0x1ff8,recvbuflen,(char **)&i,&j), iVar1 != 0)
    {
      dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_60b0);
      if (4.0 < dVar2) {
        printf("Error reading data from a Hokuyo : Message timeout. \n");
        return 2;
      }
      if (0x3ffe < recvbuflen) {
        printf("Error reading data from a Hokuyo : Invalid data. \n");
        return 4;
      }
      iVar1 = ReadRS232Port(&pHokuyo->RS232Port,(uint8 *)(savebuf + (long)recvbuflen + 0x1ff8),
                            0x3fff - recvbuflen,&local_6040);
      if (iVar1 != 0) {
        printf("Error reading data from a Hokuyo. \n");
        return 1;
      }
      recvbuflen = local_6040 + recvbuflen;
    }
    memset(databuf,0,(long)databuflen);
    k = 0x19;
    do {
      if ((_i[k] == '\n') && (_i[k + 1] == '\n')) {
        j = k + 2;
        chrono._68_4_ = (k + -0x19) / 0x42;
        chrono.Suspended = (k + -0x19) % 0x42 + -2;
        if (chrono.Suspended < 1) {
          local_60b4 = chrono._68_4_ << 6;
        }
        else {
          local_60b4 = chrono._68_4_ * 0x40 + chrono.Suspended;
        }
        *pNbdatabytes = local_60b4;
        if (databuflen < *pNbdatabytes) {
          printf("Too small data buffer.\n");
          return 1;
        }
        if (0 < *pNbdatabytes) {
          nbFullDataBlocks = 0;
          k = 0x1a;
          for (PartialDataBlockLen = 0; PartialDataBlockLen < (int)chrono._68_4_;
              PartialDataBlockLen = PartialDataBlockLen + 1) {
            memcpy(databuf + nbFullDataBlocks,_i + k,0x40);
            nbFullDataBlocks = nbFullDataBlocks + 0x40;
            k = k + 0x42;
          }
          if (0 < chrono.Suspended) {
            memcpy(databuf + nbFullDataBlocks,_i + k,(long)chrono.Suspended);
          }
        }
        return 0;
      }
      k = k + 1;
    } while (k < j + -1);
    printf("Error reading data from a Hokuyo. \n");
  }
  else {
    printf("Error reading data from a Hokuyo. \n");
  }
  return 1;
}

Assistant:

inline int GetLatestHokuyoMessageHokuyo(HOKUYO* pHokuyo, char* databuf, int databuflen, int* pNbdatabytes)
{
	char recvbuf[2*MAX_NB_BYTES_HOKUYO];
	char savebuf[MAX_NB_BYTES_HOKUYO];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr = NULL;
	int len = 0;
	int i = 0, j = 0, k = 0, nbFullDataBlocks = 0, PartialDataBlockLen = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_HOKUYO-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Hokuyo. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_HOKUYO)
			{
				printf("Error reading data from a Hokuyo : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a Hokuyo. \n");
				return EXIT_FAILURE;
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	while (FindLatestHokuyoMessage(recvbuf, BytesReceived, &ptr, &len) != EXIT_SUCCESS)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_HOKUYO)
		{
			printf("Error reading data from a Hokuyo : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_HOKUYO-1)
		{
			printf("Error reading data from a Hokuyo : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_HOKUYO-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Hokuyo. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += Bytes;
	}

	// Get data bytes.
	memset(databuf, 0, databuflen);
		
	// MD response...
	// "MD%04d%04d%02d%01d%02d\n99b\n%04d%01d\n  %01d\n    %01d\n\n" ..., &RemainingScans, &TimeStamp, &sum

	i = 25;
	for (;;)
	{
		if ((ptr[i] == '\n')&&(ptr[i+1] == '\n')) break;
		i++;
		if (i >= len-1) 
		{
			printf("Error reading data from a Hokuyo. \n");
			return EXIT_FAILURE;
		}
	}

	len = i+2;

	nbFullDataBlocks = (len-27)/66;
	PartialDataBlockLen = (len-27)%66-2;

	// If PartialDataBlockLen <= 0, no partial block, only full of 64 bytes.
	*pNbdatabytes = (PartialDataBlockLen <= 0)? 64*nbFullDataBlocks: 64*nbFullDataBlocks+PartialDataBlockLen;

	// Check the number of data bytes before copy.
	if (databuflen < *pNbdatabytes)
	{
		printf("Too small data buffer.\n");
		return EXIT_FAILURE;
	}

	// Copy the data bytes of the message.
	if (*pNbdatabytes > 0)
	{
		j = 0;
		i = 26;
		for (k = 0; k < nbFullDataBlocks; k++)
		{
			memcpy(databuf+j, ptr+i, 64);
			j += 64;
			i += 66;
		}
		if (PartialDataBlockLen > 0) memcpy(databuf+j, ptr+i, PartialDataBlockLen);
	}

	return EXIT_SUCCESS;
}